

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O3

CURLcode ftp_do_more(Curl_easy *data,int *completep)

{
  byte *pbVar1;
  uint uVar2;
  connectdata *pcVar3;
  FTP *pFVar4;
  connectdata *pcVar5;
  curl_trc_feat *pcVar6;
  _Bool _Var7;
  CURLcode CVar8;
  ulong in_RAX;
  ftpstate newstate;
  char *pcVar9;
  _Bool serv_conned;
  _Bool connected;
  undefined8 uStack_38;
  
  pcVar3 = data->conn;
  uStack_38 = in_RAX & 0xffffffffffffff;
  if (pcVar3->cfilter[1] != (Curl_cfilter *)0x0) {
    CVar8 = Curl_conn_connect(data,1,false,(_Bool *)((long)&uStack_38 + 7));
    if (CVar8 != CURLE_OK) {
      if ((pcVar3->proto).ftpc.count1 != 0) {
        return CVar8;
      }
      *completep = -1;
      CVar8 = ftp_epsv_disable(data,pcVar3);
      return CVar8;
    }
    _Var7 = Curl_conn_is_ip_connected(data,1);
    if (!_Var7) {
      return CURLE_OK;
    }
  }
  pFVar4 = (data->req).p.ftp;
  if ((pcVar3->proto).ftpc.state != '\0') {
    pcVar5 = data->conn;
    CVar8 = Curl_pp_statemach(data,&(pcVar5->proto).ftpc.pp,false,false);
    *completep = (uint)((pcVar5->proto).ftpc.state == '\0');
    if (CVar8 != CURLE_OK) {
      return CVar8;
    }
    if ((*(byte *)((long)&pcVar3->proto + 0x112) & 0x20) == 0) {
      return CURLE_OK;
    }
    *completep = 0;
  }
  if (PPTRANSFER_INFO < pFVar4->transfer) {
    Curl_xfer_setup_nop(data);
    if ((*(byte *)((long)&pcVar3->proto + 0x112) & 0x20) != 0) {
      return CURLE_OK;
    }
    *completep = 1;
    if (((data->set).field_0x8cd & 0x10) == 0) {
      return CURLE_OK;
    }
    pcVar6 = (data->state).feat;
    if ((pcVar6 != (curl_trc_feat *)0x0) && (pcVar6->log_level < 1)) {
      return CURLE_OK;
    }
    if (Curl_trc_feat_ftp.log_level < 1) {
      return CURLE_OK;
    }
    if (data->conn == (connectdata *)0x0) {
      pcVar9 = "???";
    }
    else {
      pcVar9 = ftp_state_names[(data->conn->proto).ftpc.state];
    }
    Curl_trc_ftp(data,"[%s] DO-MORE phase ends with %d",pcVar9,0);
    return CURLE_OK;
  }
  if ((*(byte *)((long)&pcVar3->proto + 0x112) & 0x20) != 0) {
    CVar8 = ReceivedServerConnect(data,(_Bool *)((long)&uStack_38 + 6));
    if (CVar8 != CURLE_OK) {
      return CVar8;
    }
    if (uStack_38._6_1_ == '\x01') {
      CVar8 = AcceptServerConnect(data);
      pbVar1 = (byte *)((long)&pcVar3->proto + 0x112);
      *pbVar1 = *pbVar1 & 0xdf;
      if (CVar8 != CURLE_OK) {
        return CVar8;
      }
      CVar8 = InitiateTransfer(data);
      if (CVar8 != CURLE_OK) {
        return CVar8;
      }
      *completep = 1;
    }
    return CURLE_OK;
  }
  uVar2 = *(uint *)&(data->state).field_0x774;
  if ((uVar2 >> 0x11 & 1) == 0) {
    pFVar4->downloadsize = -1;
    CVar8 = Curl_range(data);
    if (CVar8 != CURLE_OK) goto LAB_0012876d;
    if (-1 < (data->req).maxdownload) {
      pbVar1 = (byte *)((long)&pcVar3->proto + 0x112);
      *pbVar1 = *pbVar1 | 2;
    }
    uVar2 = *(uint *)&(data->state).field_0x774;
    if (((uVar2 >> 0xd & 1) == 0) && ((pcVar3->proto).ftpc.file != (char *)0x0)) {
      _Var7 = (_Bool)((byte)(uVar2 >> 0xc) & 1);
      newstate = '\x15';
    }
    else {
      if (pFVar4->transfer != PPTRANSFER_BODY) goto LAB_0012876d;
      _Var7 = true;
      newstate = '\x14';
    }
  }
  else {
    _Var7 = (_Bool)((byte)(uVar2 >> 0xc) & 1);
    newstate = '\x16';
  }
  CVar8 = ftp_nb_type(data,pcVar3,_Var7,newstate);
  if (CVar8 != CURLE_OK) {
    return CVar8;
  }
LAB_0012876d:
  pcVar3 = data->conn;
  CVar8 = Curl_pp_statemach(data,&(pcVar3->proto).ftpc.pp,false,false);
  *completep = (uint)((pcVar3->proto).ftpc.state == '\0');
  return CVar8;
}

Assistant:

static CURLcode ftp_do_more(struct Curl_easy *data, int *completep)
{
  struct connectdata *conn = data->conn;
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  CURLcode result = CURLE_OK;
  bool connected = FALSE;
  bool complete = FALSE;

  /* the ftp struct is inited in ftp_connect(). If we are connecting to an HTTP
   * proxy then the state will not be valid until after that connection is
   * complete */
  struct FTP *ftp = NULL;

  /* if the second connection is not done yet, wait for it to have
   * connected to the remote host. When using proxy tunneling, this
   * means the tunnel needs to have been establish. However, we
   * can not expect the remote host to talk to us in any way yet.
   * So, when using ftps: the SSL handshake will not start until we
   * tell the remote server that we are there. */
  if(conn->cfilter[SECONDARYSOCKET]) {
    result = Curl_conn_connect(data, SECONDARYSOCKET, FALSE, &connected);
    if(result || !Curl_conn_is_ip_connected(data, SECONDARYSOCKET)) {
      if(result && (ftpc->count1 == 0)) {
        *completep = -1; /* go back to DOING please */
        /* this is a EPSV connect failing, try PASV instead */
        return ftp_epsv_disable(data, conn);
      }
      return result;
    }
  }

  /* Curl_proxy_connect might have moved the protocol state */
  ftp = data->req.p.ftp;

  if(ftpc->state) {
    /* already in a state so skip the initial commands.
       They are only done to kickstart the do_more state */
    result = ftp_multi_statemach(data, &complete);

    *completep = (int)complete;

    /* if we got an error or if we do not wait for a data connection return
       immediately */
    if(result || !ftpc->wait_data_conn)
      return result;

    /* if we reach the end of the FTP state machine here, *complete will be
       TRUE but so is ftpc->wait_data_conn, which says we need to wait for the
       data connection and therefore we are not actually complete */
    *completep = 0;
  }

  if(ftp->transfer <= PPTRANSFER_INFO) {
    /* a transfer is about to take place, or if not a filename was given so we
       will do a SIZE on it later and then we need the right TYPE first */

    if(ftpc->wait_data_conn) {
      bool serv_conned;

      result = ReceivedServerConnect(data, &serv_conned);
      if(result)
        return result; /* Failed to accept data connection */

      if(serv_conned) {
        /* It looks data connection is established */
        result = AcceptServerConnect(data);
        ftpc->wait_data_conn = FALSE;
        if(!result)
          result = InitiateTransfer(data);

        if(result)
          return result;

        *completep = 1; /* this state is now complete when the server has
                           connected back to us */
      }
    }
    else if(data->state.upload) {
      result = ftp_nb_type(data, conn, data->state.prefer_ascii,
                           FTP_STOR_TYPE);
      if(result)
        return result;

      result = ftp_multi_statemach(data, &complete);
      *completep = (int)complete;
    }
    else {
      /* download */
      ftp->downloadsize = -1; /* unknown as of yet */

      result = Curl_range(data);

      if(result == CURLE_OK && data->req.maxdownload >= 0) {
        /* Do not check for successful transfer */
        ftpc->dont_check = TRUE;
      }

      if(result)
        ;
      else if(data->state.list_only || !ftpc->file) {
        /* The specified path ends with a slash, and therefore we think this
           is a directory that is requested, use LIST. But before that we
           need to set ASCII transfer mode. */

        /* But only if a body transfer was requested. */
        if(ftp->transfer == PPTRANSFER_BODY) {
          result = ftp_nb_type(data, conn, TRUE, FTP_LIST_TYPE);
          if(result)
            return result;
        }
        /* otherwise just fall through */
      }
      else {
        result = ftp_nb_type(data, conn, data->state.prefer_ascii,
                             FTP_RETR_TYPE);
        if(result)
          return result;
      }

      result = ftp_multi_statemach(data, &complete);
      *completep = (int)complete;
    }
    return result;
  }

  /* no data to transfer */
  Curl_xfer_setup_nop(data);

  if(!ftpc->wait_data_conn) {
    /* no waiting for the data connection so this is now complete */
    *completep = 1;
    CURL_TRC_FTP(data, "[%s] DO-MORE phase ends with %d", FTP_DSTATE(data),
                 (int)result);
  }

  return result;
}